

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_activateAndApply
          (sysbvm_context_t *context,sysbvm_tuple_t function_,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  sysbvm_tuple_t *psVar4;
  undefined8 uStack_370;
  undefined1 local_368 [8];
  sysbvm_stackFrameBytecodeFunctionActivationRecord_t activationRecord;
  
  uStack_370 = 0x14b9f0;
  memset((sysbvm_stackFrameRecord_t *)local_368,0,0x338);
  activationRecord.previous._0_4_ = 2;
  uStack_370 = 0x14ba00;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_368);
  activationRecord.function = *(sysbvm_tuple_t *)(function_ + 0x48);
  activationRecord.functionDefinition = *(sysbvm_tuple_t *)(activationRecord.function + 0x80);
  activationRecord.functionBytecode = *(sysbvm_tuple_t *)(function_ + 0x38);
  activationRecord.captureVector = *(sysbvm_tuple_t *)(activationRecord.functionDefinition + 0x28);
  activationRecord.literalVector = *(ulong *)(activationRecord.functionDefinition + 0x30);
  activationRecord._8_8_ = function_;
  activationRecord.instructions = argumentCount;
  activationRecord.argumentCount = (size_t)arguments;
  if (((activationRecord.literalVector & 0xf) != 0 || activationRecord.literalVector == 0) ||
     ((*(uint *)(activationRecord.literalVector + 8) & 0x300) != 0x200)) {
    uStack_370 = 0x14ba67;
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecode.c:557: assertion failure: sysbvm_tuple_isBytes(activationRecord.instructions)"
              );
  }
  activationRecord.result = 0;
  uVar1 = *(ulong *)(activationRecord.functionDefinition + 0x20);
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    psVar4 = (sysbvm_tuple_t *)((long)uVar1 >> 4);
  }
  else {
    psVar4 = *(sysbvm_tuple_t **)(uVar1 + 0x10);
  }
  lVar2 = -((long)psVar4 * 8 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)(local_368 + lVar2 + -8) = 0x14bac0;
  memset(local_368 + lVar2,0,(long)psVar4 * 8);
  activationRecord.arguments = psVar4;
  activationRecord.inlineLocalVectorSize = (size_t)(local_368 + lVar2);
  *(undefined8 *)(local_368 + lVar2 + -8) = 0x14bada;
  iVar3 = _setjmp((__jmp_buf_tag *)&activationRecord.pc);
  if (iVar3 == 0) {
    *(undefined8 *)(local_368 + lVar2 + -8) = 0x14baed;
    sysbvm_bytecodeInterpreter_interpretWithActivationRecord
              (context,(sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)local_368);
  }
  *(undefined8 *)(local_368 + lVar2 + -8) = 0x14bafc;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_368);
  return activationRecord.operandRegisterFile[0x3f];
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_activateAndApply(sysbvm_context_t *context, sysbvm_tuple_t function_, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    sysbvm_stackFrameBytecodeFunctionActivationRecord_t activationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&activationRecord);  

    activationRecord.function = function_;
    sysbvm_function_t **functionObject = (sysbvm_function_t**)&activationRecord.function;
    
    activationRecord.functionDefinition = (*functionObject)->definition;
    sysbvm_functionDefinition_t **functionDefinitionObject = (sysbvm_functionDefinition_t**)&activationRecord.functionDefinition;

    activationRecord.functionBytecode = (*functionDefinitionObject)->bytecode;
    sysbvm_functionBytecode_t **functionBytecodeObject = (sysbvm_functionBytecode_t **)&activationRecord.functionBytecode;

    activationRecord.argumentCount = argumentCount;
    activationRecord.arguments = arguments;

    activationRecord.captureVector = (*functionObject)->captureVector;
    activationRecord.literalVector = (*functionBytecodeObject)->literalVector;
    activationRecord.instructions = (*functionBytecodeObject)->instructions;
    SYSBVM_ASSERT(sysbvm_tuple_isBytes(activationRecord.instructions));

    // Set the initial PC.
    activationRecord.pc = 0;

    // Allocate the inline local vector.
    size_t requiredLocalVectorSize = sysbvm_tuple_size_decode((*functionBytecodeObject)->localVectorSize);
    sysbvm_tuple_t *inlineLocalVector = (sysbvm_tuple_t *)alloca(requiredLocalVectorSize * sizeof(sysbvm_tuple_t));
    memset(inlineLocalVector, 0, requiredLocalVectorSize * sizeof(sysbvm_tuple_t));

    activationRecord.inlineLocalVectorSize = requiredLocalVectorSize;
    activationRecord.inlineLocalVector = inlineLocalVector;

    // Interpret.
    if(!_setjmp(activationRecord.jmpbuffer))
        sysbvm_bytecodeInterpreter_interpretWithActivationRecord(context, &activationRecord);

    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&activationRecord);
    return activationRecord.result;
}